

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptRegExp::DeleteProperty
          (JavascriptRegExp *this,JavascriptString *propertyNameString,PropertyOperationFlags flags)

{
  char cVar1;
  ScriptContext *pSVar2;
  bool bVar3;
  BOOL BVar4;
  ThreadConfiguration *pTVar5;
  char16 *varName;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar3 = BuiltInPropertyRecord<10>::Equals
                    ((BuiltInPropertyRecord<10> *)BuiltInPropertyRecords::lastIndex,
                     propertyNameString);
  if (!bVar3) {
    bVar3 = BuiltInPropertyRecord<7>::Equals
                      ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::global,propertyNameString
                      );
    if ((((bVar3) ||
         (bVar3 = BuiltInPropertyRecord<10>::Equals
                            ((BuiltInPropertyRecord<10> *)BuiltInPropertyRecords::multiline,
                             propertyNameString), bVar3)) ||
        (bVar3 = BuiltInPropertyRecord<11>::Equals
                           ((BuiltInPropertyRecord<11> *)BuiltInPropertyRecords::ignoreCase,
                            propertyNameString), bVar3)) ||
       ((bVar3 = BuiltInPropertyRecord<7>::Equals
                           ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::source,
                            propertyNameString), bVar3 ||
        (bVar3 = BuiltInPropertyRecord<8>::Equals
                           ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::options,
                            propertyNameString), bVar3)))) {
      pTVar5 = (pSVar2->config).threadConfig;
    }
    else {
      bVar3 = BuiltInPropertyRecord<8>::Equals
                        ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::unicode,
                         propertyNameString);
      if (bVar3) {
        pTVar5 = (pSVar2->config).threadConfig;
        cVar1 = pTVar5->m_ES6Unicode;
      }
      else {
        bVar3 = BuiltInPropertyRecord<7>::Equals
                          ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::dotAll,
                           propertyNameString);
        if (bVar3) {
          pTVar5 = (pSVar2->config).threadConfig;
          cVar1 = pTVar5->m_ES2018RegExDotAll;
        }
        else {
          bVar3 = BuiltInPropertyRecord<7>::Equals
                            ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::sticky,
                             propertyNameString);
          if (!bVar3) goto LAB_00d0852b;
          pTVar5 = (pSVar2->config).threadConfig;
          cVar1 = pTVar5->m_ES6RegExSticky;
        }
      }
      if (cVar1 != '\x01') goto LAB_00d0852b;
    }
    if (pTVar5->m_ES6RegExPrototypeProperties != false) {
LAB_00d0852b:
      BVar4 = DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyNameString,flags);
      return BVar4;
    }
  }
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  varName = JavascriptString::GetString(propertyNameString);
  JavascriptError::ThrowCantDeleteIfStrictMode(flags,pSVar2,varName);
  return 0;
}

Assistant:

BOOL JavascriptRegExp::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define DELETE_PROPERTY(ownProperty) \
        if (ownProperty) \
        { \
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, this->GetScriptContext(), propertyNameString->GetString()); \
            return false; \
        } \
        return DynamicObject::DeleteProperty(propertyNameString, flags);

        if (BuiltInPropertyRecords::lastIndex.Equals(propertyNameString))
        {
            DELETE_PROPERTY(true);
        }
        else if (BuiltInPropertyRecords::global.Equals(propertyNameString)
            || BuiltInPropertyRecords::multiline.Equals(propertyNameString)
            || BuiltInPropertyRecords::ignoreCase.Equals(propertyNameString)
            || BuiltInPropertyRecords::source.Equals(propertyNameString)
            || BuiltInPropertyRecords::options.Equals(propertyNameString))
        {
            DELETE_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else if (BuiltInPropertyRecords::unicode.Equals(propertyNameString))
        {
            DELETE_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else if (BuiltInPropertyRecords::dotAll.Equals(propertyNameString))
        {
            DELETE_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else if (BuiltInPropertyRecords::sticky.Equals(propertyNameString))
        {
            DELETE_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        }
        else
        {
            return DynamicObject::DeleteProperty(propertyNameString, flags);
        }

#undef DELETE_PROPERTY

    }